

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O1

int Sbc_ManAddInternalToPath_rec(Gia_Man_t *p,int iObj,Vec_Bit_t *vPath)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  if (p->nTravIdsAlloc <= iObj) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[iObj] == p->nTravIds) {
    if (iObj < 0) goto LAB_005455ee;
  }
  else {
    p->pTravIds[iObj] = p->nTravIds;
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar6 = (uint)*(undefined8 *)(p->pObjs + (uint)iObj);
    if ((~uVar6 & 0x9fffffff) != 0) {
      if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                      ,0x38,"int Sbc_ManAddInternalToPath_rec(Gia_Man_t *, int, Vec_Bit_t *)");
      }
      pVVar4 = p->vMapping;
      iVar2 = pVVar4->nSize;
      if (iObj < iVar2) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          piVar1 = pVVar4->pArray;
          lVar5 = (long)piVar1[(uint)iObj];
          if ((lVar5 < 0) || (iVar2 <= piVar1[(uint)iObj])) break;
          if (piVar1[lVar5] <= lVar7) {
            if (uVar6 == 0) {
              return 0;
            }
            if (iObj < vPath->nSize) {
              vPath->pArray[(uint)iObj >> 5] =
                   vPath->pArray[(uint)iObj >> 5] | 1 << ((byte)iObj & 0x1f);
              return uVar6;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          uVar3 = Sbc_ManAddInternalToPath_rec(p,piVar1[lVar5 + lVar7 + 1],vPath);
          uVar6 = uVar6 | uVar3;
          lVar7 = lVar7 + 1;
          pVVar4 = p->vMapping;
          iVar2 = pVVar4->nSize;
        } while (iObj < iVar2);
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
  if (iObj < vPath->nSize) {
    return (uint)(((uint)vPath->pArray[(uint)iObj >> 5] >> (iObj & 0x1fU) & 1) != 0);
  }
LAB_005455ee:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sbc_ManAddInternalToPath_rec( Gia_Man_t * p, int iObj, Vec_Bit_t * vPath )
{
    Gia_Obj_t * pObj; 
    int k, iFan, Value = 0;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return Vec_BitEntry(vPath, iObj);
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return Vec_BitEntry(vPath, iObj);
    assert( Gia_ObjIsAnd(pObj) );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Value |= Sbc_ManAddInternalToPath_rec( p, iFan, vPath );
    if ( Value )
        Vec_BitWriteEntry( vPath, iObj, 1 );
    return Value;
}